

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  lbool lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  gzFile i;
  FILE *__s;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  double dVar12;
  int argc_local;
  vec<Minisat::Lit,_int> dummy;
  int local_4b8;
  int local_4b4;
  int local_4ac;
  Lit local_49c;
  vec<Minisat::Lit,_int> local_498;
  double local_480;
  gzFile local_478;
  char **local_470;
  BoolOption strictp;
  IntOption mem_lim;
  IntOption cpu_lim;
  IntOption verb;
  Solver S;
  long local_388;
  uint local_2a8;
  uint local_ec;
  
  argc_local = argc;
  Minisat::setUsageHelp
            (
            "USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or gzipped DIMACS.\n"
            );
  Minisat::setX86FPUPrecision();
  Minisat::IntOption::IntOption
            (&verb,"MAIN","verb","Verbosity level (0=silent, 1=some, 2=more).",1,
             (IntRange)0x200000000);
  Minisat::IntOption::IntOption
            (&cpu_lim,"MAIN","cpu-lim","Limit on CPU time allowed in seconds.\n",0,
             (IntRange)0x7fffffff00000000);
  Minisat::IntOption::IntOption
            (&mem_lim,"MAIN","mem-lim","Limit on memory usage in megabytes.\n",0,
             (IntRange)0x7fffffff00000000);
  Minisat::BoolOption::BoolOption
            (&strictp,"MAIN","strict","Validate DIMACS header during parsing.",false);
  Minisat::parseOptions(&argc_local,argv,true);
  Minisat::Solver::Solver(&S);
  local_480 = Minisat::cpuTime();
  solver = &S;
  Minisat::sigTerm(SIGINT_exit);
  if (cpu_lim.value != 0) {
    Minisat::limitTime(cpu_lim.value);
  }
  if ((long)mem_lim.value != 0) {
    Minisat::limitMemory((long)mem_lim.value);
  }
  if ((argc_local == 1) &&
     (puts("Reading from standard input... Use \'--help\' for help."), argc_local == 1)) {
    i = (gzFile)gzdopen(0,"rb");
  }
  else {
    i = (gzFile)gzopen(argv[1],"rb");
  }
  if (i == (gzFile)0x0) {
    if (argc_local == 1) {
      pcVar6 = "<stdin>";
    }
    else {
      pcVar6 = argv[1];
    }
    printf("ERROR! Could not open file: %s\n",pcVar6);
    iVar5 = 1;
  }
  else {
    if (0 < verb.value) {
      puts("============================[ Problem Statistics ]=============================");
      puts("|                                                                             |");
    }
    Minisat::StreamBuffer::StreamBuffer((StreamBuffer *)&dummy,i);
    local_498.data = (Lit *)0x0;
    local_498.sz = 0;
    local_498.cap = 0;
    iVar5 = 0;
    local_4ac = 0;
    local_478 = i;
    local_470 = argv;
LAB_001035de:
    Minisat::skipWhitespace<Minisat::StreamBuffer>((StreamBuffer *)&dummy);
    if (local_4b8 < local_4b4) {
      if (*(char *)(dummy._8_8_ + (long)local_4b8) == 'p') {
        lVar11 = 0;
        while( true ) {
          if (lVar11 == 5) break;
          uVar8 = 0xffffffff;
          if (local_4b8 < local_4b4) {
            uVar8 = (uint)*(byte *)(dummy._8_8_ + (long)local_4b8);
          }
          if (uVar8 != (int)"p cnf"[lVar11]) break;
          lVar11 = lVar11 + 1;
          Minisat::StreamBuffer::operator++((StreamBuffer *)&dummy);
        }
        if ("p cnf"[lVar11] != '\0') {
          if (local_4b8 < local_4b4) {
            uVar9 = (ulong)*(byte *)(dummy._8_8_ + (long)local_4b8);
          }
          else {
            uVar9 = 0xffffffffffffffff;
          }
          printf("PARSE ERROR! Unexpected char: %c\n",uVar9);
          iVar5 = 3;
          goto LAB_001039af;
        }
        Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&dummy);
        local_4ac = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&dummy);
      }
      else if (*(char *)(dummy._8_8_ + (long)local_4b8) == 'c') {
        do {
          if (local_4b4 <= local_4b8) break;
          cVar1 = *(char *)(dummy._8_8_ + (long)local_4b8);
          Minisat::StreamBuffer::operator++((StreamBuffer *)&dummy);
        } while (cVar1 != '\n');
      }
      else {
        if (local_498.data != (Lit *)0x0) {
          local_498._8_8_ = local_498._8_8_ & 0xffffffff00000000;
        }
        while (iVar4 = Minisat::parseInt<Minisat::StreamBuffer>((StreamBuffer *)&dummy), iVar4 != 0)
        {
          iVar10 = -iVar4;
          if (0 < iVar4) {
            iVar10 = iVar4;
          }
          while ((int)local_ec < iVar10) {
            Minisat::Solver::newVar((lbool)(uint8_t)(vec *)&S,true);
          }
          local_49c.x = ((iVar4 < 1) - 2) + iVar10 * 2;
          Minisat::vec<Minisat::Lit,_int>::push(&local_498,&local_49c);
        }
        iVar5 = iVar5 + 1;
        Minisat::Solver::addClause_((vec *)&S);
      }
      goto LAB_001035de;
    }
    if ((strictp.value != false) && (iVar5 != local_4ac)) {
      puts("PARSE ERROR! DIMACS header mismatch: wrong number of clauses");
    }
    Minisat::vec<Minisat::Lit,_int>::~vec(&local_498);
    free((void *)dummy._8_8_);
    gzclose(local_478);
    if (argc_local < 3) {
      __s = (FILE *)0x0;
    }
    else {
      __s = fopen(local_470[2],"wb");
    }
    if (0 < verb.value) {
      printf("|  Number of variables:  %12d                                         |\n",
             (ulong)local_ec);
      printf("|  Number of clauses:    %12d                                         |\n",
             (ulong)local_2a8);
    }
    dVar12 = Minisat::cpuTime();
    if (0 < verb.value) {
      printf("|  Parse time:           %12.2f s                                       |\n",
             dVar12 - local_480);
      puts("|                                                                             |");
    }
    Minisat::sigTerm(SIGINT_interrupt);
    cVar1 = Minisat::Solver::simplify();
    if (cVar1 != '\0') {
      dummy.data = (Lit *)0x0;
      dummy.sz = 0;
      dummy.cap = 0;
      lVar2 = Minisat::Solver::solveLimited(&S,&dummy);
      if (0 < verb.value) {
        Minisat::Solver::printStats();
        putchar(10);
      }
      pcVar6 = "INDETERMINATE\n";
      if (lVar2.value == '\x01') {
        pcVar6 = "UNSATISFIABLE\n";
      }
      pcVar7 = "SATISFIABLE\n";
      if (lVar2.value != '\0') {
        pcVar7 = pcVar6;
      }
      printf(pcVar7);
      if (__s != (FILE *)0x0) {
        if (lVar2.value == '\0') {
          fwrite("SAT\n",4,1,__s);
          uVar9 = 0;
          while ((long)uVar9 < (long)(int)local_ec) {
            bVar3 = Minisat::lbool::operator!=((lbool *)(local_388 + uVar9),(lbool)0x2);
            if (bVar3) {
              pcVar6 = " ";
              if (uVar9 == 0) {
                pcVar6 = "";
              }
              pcVar7 = "-";
              if (*(char *)(local_388 + uVar9) == '\0') {
                pcVar7 = "";
              }
              uVar9 = uVar9 + 1;
              fprintf(__s,"%s%s%d",pcVar6,pcVar7,uVar9 & 0xffffffff);
            }
            else {
              uVar9 = uVar9 + 1;
            }
          }
          fwrite(" 0\n",3,1,__s);
        }
        else {
          if (lVar2.value == '\x01') {
            pcVar6 = "UNSAT\n";
          }
          else {
            pcVar6 = "INDET\n";
          }
          fwrite(pcVar6,6,1,__s);
        }
        fclose(__s);
      }
      iVar5 = 0;
      if (lVar2.value == '\x01') {
        iVar5 = 0x14;
      }
      iVar4 = 10;
      if (lVar2.value != '\0') {
        iVar4 = iVar5;
      }
      Minisat::vec<Minisat::Lit,_int>::~vec(&dummy);
      Minisat::Solver::~Solver(&S);
      return iVar4;
    }
    if (__s != (FILE *)0x0) {
      fwrite("UNSAT\n",6,1,__s);
      fclose(__s);
    }
    if (0 < verb.value) {
      puts("===============================================================================");
      puts("Solved by unit propagation");
      Minisat::Solver::printStats();
      putchar(10);
    }
    puts("UNSATISFIABLE");
    iVar5 = 0x14;
  }
LAB_001039af:
  exit(iVar5);
}

Assistant:

int main(int argc, char** argv)
{
    try {
        setUsageHelp("USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or gzipped DIMACS.\n");
        setX86FPUPrecision();

        // Extra options:
        //
        IntOption    verb   ("MAIN", "verb",   "Verbosity level (0=silent, 1=some, 2=more).", 1, IntRange(0, 2));
        IntOption    cpu_lim("MAIN", "cpu-lim","Limit on CPU time allowed in seconds.\n", 0, IntRange(0, INT32_MAX));
        IntOption    mem_lim("MAIN", "mem-lim","Limit on memory usage in megabytes.\n", 0, IntRange(0, INT32_MAX));
        BoolOption   strictp("MAIN", "strict", "Validate DIMACS header during parsing.", false);
        
        parseOptions(argc, argv, true);

        Solver S;
        double initial_time = cpuTime();

        S.verbosity = verb;
        
        solver = &S;
        // Use signal handlers that forcibly quit until the solver will be able to respond to
        // interrupts:
        sigTerm(SIGINT_exit);

        // Try to set resource limits:
        if (cpu_lim != 0) limitTime(cpu_lim);
        if (mem_lim != 0) limitMemory(mem_lim);
        
        if (argc == 1)
            printf("Reading from standard input... Use '--help' for help.\n");
        
        gzFile in = (argc == 1) ? gzdopen(0, "rb") : gzopen(argv[1], "rb");
        if (in == NULL)
            printf("ERROR! Could not open file: %s\n", argc == 1 ? "<stdin>" : argv[1]), exit(1);
        
        if (S.verbosity > 0){
            printf("============================[ Problem Statistics ]=============================\n");
            printf("|                                                                             |\n"); }
        
        parse_DIMACS(in, S, (bool)strictp);
        gzclose(in);
        FILE* res = (argc >= 3) ? fopen(argv[2], "wb") : NULL;
        
        if (S.verbosity > 0){
            printf("|  Number of variables:  %12d                                         |\n", S.nVars());
            printf("|  Number of clauses:    %12d                                         |\n", S.nClauses()); }
        
        double parsed_time = cpuTime();
        if (S.verbosity > 0){
            printf("|  Parse time:           %12.2f s                                       |\n", parsed_time - initial_time);
            printf("|                                                                             |\n"); }
 
        // Change to signal-handlers that will only notify the solver and allow it to terminate
        // voluntarily:
        sigTerm(SIGINT_interrupt);
       
        if (!S.simplify()){
            if (res != NULL) fprintf(res, "UNSAT\n"), fclose(res);
            if (S.verbosity > 0){
                printf("===============================================================================\n");
                printf("Solved by unit propagation\n");
                S.printStats();
                printf("\n"); }
            printf("UNSATISFIABLE\n");
            exit(20);
        }
        
        vec<Lit> dummy;
        lbool ret = S.solveLimited(dummy);
        if (S.verbosity > 0){
            S.printStats();
            printf("\n"); }
        printf(ret == l_True ? "SATISFIABLE\n" : ret == l_False ? "UNSATISFIABLE\n" : "INDETERMINATE\n");
        if (res != NULL){
            if (ret == l_True){
                fprintf(res, "SAT\n");
                for (int i = 0; i < S.nVars(); i++)
                    if (S.model[i] != l_Undef)
                        fprintf(res, "%s%s%d", (i==0)?"":" ", (S.model[i]==l_True)?"":"-", i+1);
                fprintf(res, " 0\n");
            }else if (ret == l_False)
                fprintf(res, "UNSAT\n");
            else
                fprintf(res, "INDET\n");
            fclose(res);
        }
        
#ifdef NDEBUG
        exit(ret == l_True ? 10 : ret == l_False ? 20 : 0);     // (faster than "return", which will invoke the destructor for 'Solver')
#else
        return (ret == l_True ? 10 : ret == l_False ? 20 : 0);
#endif
    } catch (OutOfMemoryException&){
        printf("===============================================================================\n");
        printf("INDETERMINATE\n");
        exit(0);
    }
}